

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

tuple<unsigned_long,_unsigned_long> __thiscall Controller::getBoardAttributes(Controller *this)

{
  BoardMode BVar1;
  pointer pBVar2;
  pointer this_00;
  size_t sVar3;
  mapped_type *__a1;
  _Head_base<0UL,_unsigned_long,_false> extraout_RDX;
  unique_ptr<Board,_std::default_delete<Board>_> *in_RSI;
  tuple<unsigned_long,_unsigned_long> tVar4;
  uint local_40;
  uint local_20;
  BoardSize local_1c;
  uint tileSize;
  BoardSize boardSize;
  Controller *this_local;
  
  this_local = this;
  pBVar2 = std::unique_ptr<Board,_std::default_delete<Board>_>::operator->(in_RSI);
  local_1c = Board::getSize(pBVar2);
  pBVar2 = std::unique_ptr<Board,_std::default_delete<Board>_>::operator->(in_RSI);
  BVar1 = Board::getMode(pBVar2);
  if (BVar1 == NUMERIC) {
    local_40 = Options::getTileSize();
  }
  else {
    this_00 = std::unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_>::operator->
                        ((unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_> *)
                         (in_RSI + 1));
    sVar3 = ImageProvider::getTileSize(this_00,local_1c);
    local_40 = (uint)sVar3;
  }
  local_20 = local_40;
  __a1 = std::
         map<BoardSize,_unsigned_long,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_unsigned_long>_>_>
         ::at(&Maps::boardSizeInt,&local_1c);
  std::tuple<unsigned_long,_unsigned_long>::tuple<const_unsigned_long_&,_unsigned_int_&,_true>
            ((tuple<unsigned_long,_unsigned_long> *)this,__a1,&local_20);
  tVar4.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = extraout_RDX._M_head_impl;
  tVar4.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
  return (tuple<unsigned_long,_unsigned_long>)
         tVar4.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>;
}

Assistant:

std::tuple<size_t, size_t> Controller::getBoardAttributes()
{
    BoardSize boardSize = board->getSize();
    uint tileSize = board->getMode() == BoardMode::NUMERIC ?
                        Options::getTileSize() : imageProvider->getTileSize( boardSize );
    return { Maps::boardSizeInt.at( boardSize ), tileSize };
}